

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsettings.cpp
# Opt level: O2

void __thiscall QSettings::endArray(QSettings *this)

{
  QObjectData *pQVar1;
  ulong uVar2;
  iterator iVar3;
  __off_t __length;
  long in_FS_OFFSET;
  int *piVar4;
  QArrayDataPointer<char16_t> local_118;
  QArrayDataPointer<char16_t> local_f8;
  QStringBuilder<QString,_QLatin1String> local_d8;
  QAnyStringView local_b0;
  value_type local_a0;
  QSettingsGroup local_78;
  QVariant local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QObject).d_ptr.d;
  if (pQVar1[2].children.d.ptr == (QObject **)0x0) {
    local_78.str.d.d._0_4_ = 2;
    local_78.str.d.size._4_4_ = 0;
    local_78.str.d.d._4_4_ = 0;
    local_78.str.d.ptr = (char16_t *)0x0;
    local_78.str.d.size._0_4_ = 0;
    local_78.num = 0x455595;
    QMessageLogger::warning
              ((QMessageLogger *)&local_78,"QSettings::endArray: No matching beginArray()");
  }
  else {
    local_78.maxNum = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.str.d.size._0_4_ = 0xaaaaaaaa;
    local_78.str.d.size._4_4_ = 0xaaaaaaaa;
    local_78.num = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.str.d.d._0_4_ = 0xaaaaaaaa;
    local_78.str.d.d._4_4_ = 0xaaaaaaaa;
    local_78.str.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    iVar3 = QList<QSettingsGroup>::end((QList<QSettingsGroup> *)&pQVar1[2].parent);
    QSettingsGroup::QSettingsGroup(&local_78,iVar3.i + -1);
    QSettingsGroup::toString(&local_d8.a,&local_78);
    uVar2 = CONCAT44(local_d8.a.d.size._4_4_,(undefined4)local_d8.a.d.size);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_d8);
    QList<QSettingsGroup>::takeLast(&local_a0,(QList<QSettingsGroup> *)&pQVar1[2].parent);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a0);
    if (uVar2 != 0) {
      QString::truncate((QString *)&pQVar1[2].children.d.size,
                        (char *)((long)&(pQVar1[2].metaObject)->_vptr_QDynamicMetaObjectData +
                                ~uVar2),__length);
    }
    if ((undefined1 *)local_78.maxNum != (undefined1 *)0xffffffffffffffff) {
      piVar4 = (int *)CONCAT44(local_78.str.d.d._4_4_,local_78.str.d.d._0_4_);
      if (piVar4 == (int *)0x0) {
        piVar4 = (int *)0x0;
      }
      else {
        LOCK();
        *piVar4 = *piVar4 + 1;
        UNLOCK();
      }
      local_f8.d = (Data *)0x0;
      local_f8.ptr = (char16_t *)0x0;
      local_d8.a.d.d._0_4_ = SUB84(piVar4,0);
      local_d8.a.d.d._4_4_ = (undefined4)((ulong)piVar4 >> 0x20);
      local_d8.a.d.ptr = local_78.str.d.ptr;
      local_f8.size = 0;
      local_d8.a.d.size._0_4_ = (undefined4)local_78.str.d.size;
      local_d8.a.d.size._4_4_ = local_78.str.d.size._4_4_;
      local_d8.b.m_size = 5;
      local_d8.b.m_data = "/size";
      local_118.d = (Data *)0x0;
      local_118.ptr = (char16_t *)0x0;
      local_118.size = 0;
      QAnyStringView::QAnyStringView<QStringBuilder<QString,_QLatin1String>,_true>
                (&local_b0,&local_d8,
                 (wrapped_t<QStringBuilder<QString,_QLatin1String>,_QString> *)&local_118);
      ::QVariant::QVariant(&local_48,local_78.maxNum);
      setValue(this,local_b0,&local_48);
      ::QVariant::~QVariant(&local_48);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_d8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
    }
    if ((char *)local_78.num == (char *)0xffffffffffffffff) {
      local_d8.a.d.d._0_4_ = 2;
      local_d8.a.d.size._4_4_ = 0;
      local_d8.a.d.d._4_4_ = 0;
      local_d8.a.d.ptr = (char16_t *)0x0;
      local_d8.a.d.size._0_4_ = 0;
      local_d8.b.m_size = 0x455595;
      QMessageLogger::warning
                ((QMessageLogger *)&local_d8,"QSettings::endArray: Expected endGroup() instead");
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSettings::endArray()
{
    Q_D(QSettings);
    if (d->groupStack.isEmpty()) {
        qWarning("QSettings::endArray: No matching beginArray()");
        return;
    }

    QSettingsGroup group = d->groupStack.top();
    qsizetype len = group.toString().size();
    d->groupStack.pop();
    if (len > 0)
        d->groupPrefix.truncate(d->groupPrefix.size() - (len + 1));

    if (group.arraySizeGuess() != -1)
        setValue(group.name() + "/size"_L1, group.arraySizeGuess());

    if (!group.isArray())
        qWarning("QSettings::endArray: Expected endGroup() instead");
}